

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PNGImageHandler.cpp
# Opt level: O0

PDFImageXObject *
CreateImageXObjectForData
          (png_structp png_ptr,png_infop info_ptr,png_bytep row,ObjectsContext *inObjectsContext)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  png_uint_32 pVar5;
  png_uint_32 pVar6;
  __jmp_buf_tag *__env;
  IndirectObjectsReferenceRegistry *pIVar7;
  ObjectIDType inObjectID;
  Trace *pTVar8;
  DictionaryContext *pDVar9;
  IByteWriter *pIVar10;
  PDFStream *this;
  bool bVar11;
  bool bVar12;
  string *local_248;
  string *local_1d0;
  ObjectIDType local_1a8;
  OutputStreamTraits local_160;
  OutputStreamTraits traits;
  InputStringBufferStream alphaWriteStream_1;
  IByteWriter *writerMaskStream;
  PDFStream *imageMaskStream;
  DictionaryContext *imageMaskContext;
  undefined1 local_128 [4];
  png_uint_32 i;
  OutputStringBufferStream alphaWriteStream;
  png_uint_32 y;
  IByteWriter *writerStream;
  DictionaryContext *imageContext;
  undefined1 local_f0 [8];
  MyStringBuf alphaComponentsData;
  ObjectIDType imageMaskObjectId;
  png_byte colorComponents;
  bool isAlpha;
  ObjectIDType imageXObjectObjectId;
  png_byte channels_count;
  png_byte transformed_bit_depth;
  png_byte transformed_color_type;
  png_uint_32 transformed_height;
  png_uint_32 transformed_width;
  EStatusCode local_54;
  PDFStream *pPStack_50;
  EStatusCode status;
  PDFStream *imageStream;
  PDFImageXObject *imageXObject;
  PDFImageXObjectList listOfImages;
  ObjectsContext *inObjectsContext_local;
  png_bytep row_local;
  png_infop info_ptr_local;
  png_structp png_ptr_local;
  
  listOfImages.super__List_base<PDFImageXObject_*,_std::allocator<PDFImageXObject_*>_>._M_impl.
  _M_node._M_size = (size_t)inObjectsContext;
  std::__cxx11::list<PDFImageXObject_*,_std::allocator<PDFImageXObject_*>_>::list
            ((list<PDFImageXObject_*,_std::allocator<PDFImageXObject_*>_> *)&imageXObject);
  imageStream = (PDFStream *)0x0;
  pPStack_50 = (PDFStream *)0x0;
  __env = (__jmp_buf_tag *)png_set_longjmp_fn(png_ptr,longjmp,200);
  iVar4 = _setjmp(__env);
  if (iVar4 != 0) {
    local_54 = eFailure;
    goto LAB_0026abbc;
  }
  pVar5 = png_get_image_width(png_ptr,info_ptr);
  pVar6 = png_get_image_height(png_ptr,info_ptr);
  bVar1 = png_get_color_type(png_ptr,info_ptr);
  bVar2 = png_get_bit_depth(png_ptr,info_ptr);
  bVar3 = png_get_channels(png_ptr,info_ptr);
  pIVar7 = ObjectsContext::GetInDirectObjectsRegistry
                     ((ObjectsContext *)
                      listOfImages.
                      super__List_base<PDFImageXObject_*,_std::allocator<PDFImageXObject_*>_>.
                      _M_impl._M_node._M_size);
  inObjectID = IndirectObjectsReferenceRegistry::AllocateNewObjectID(pIVar7);
  bVar11 = (bVar1 & 4) != 0;
  if (bVar11) {
    pIVar7 = ObjectsContext::GetInDirectObjectsRegistry
                       ((ObjectsContext *)
                        listOfImages.
                        super__List_base<PDFImageXObject_*,_std::allocator<PDFImageXObject_*>_>.
                        _M_impl._M_node._M_size);
    local_1a8 = IndirectObjectsReferenceRegistry::AllocateNewObjectID(pIVar7);
    bVar1 = bVar3 - 1;
  }
  else {
    local_1a8 = 0;
    bVar1 = bVar3;
  }
  alphaComponentsData._96_8_ = local_1a8;
  MyStringBuf::MyStringBuf((MyStringBuf *)local_f0);
  local_54 = ObjectsContext::StartNewIndirectObject
                       ((ObjectsContext *)
                        listOfImages.
                        super__List_base<PDFImageXObject_*,_std::allocator<PDFImageXObject_*>_>.
                        _M_impl._M_node._M_size,inObjectID);
  if (local_54 == eSuccess) {
    pDVar9 = ObjectsContext::StartDictionary
                       ((ObjectsContext *)
                        listOfImages.
                        super__List_base<PDFImageXObject_*,_std::allocator<PDFImageXObject_*>_>.
                        _M_impl._M_node._M_size);
    DictionaryContext::WriteKey(pDVar9,&scType_abi_cxx11_);
    DictionaryContext::WriteNameValue(pDVar9,&scXObject_abi_cxx11_);
    DictionaryContext::WriteKey(pDVar9,&scSubType_abi_cxx11_);
    DictionaryContext::WriteNameValue(pDVar9,&scImage_abi_cxx11_);
    DictionaryContext::WriteKey(pDVar9,&scWidth_abi_cxx11_);
    DictionaryContext::WriteIntegerValue(pDVar9,(ulong)pVar5);
    DictionaryContext::WriteKey(pDVar9,&scHeight_abi_cxx11_);
    DictionaryContext::WriteIntegerValue(pDVar9,(ulong)pVar6);
    DictionaryContext::WriteKey(pDVar9,&scBitsPerComponent_abi_cxx11_);
    DictionaryContext::WriteIntegerValue(pDVar9,(ulong)bVar2);
    DictionaryContext::WriteKey(pDVar9,&scColorSpace_abi_cxx11_);
    if (bVar1 == 1) {
      local_1d0 = &scDeviceGray_abi_cxx11_;
    }
    else {
      local_1d0 = &scDeviceRGB_abi_cxx11_;
    }
    DictionaryContext::WriteNameValue(pDVar9,local_1d0);
    if (bVar11) {
      DictionaryContext::WriteKey(pDVar9,&scSMask_abi_cxx11_);
      DictionaryContext::WriteNewObjectReferenceValue(pDVar9,alphaComponentsData._96_8_);
    }
    pPStack_50 = ObjectsContext::StartPDFStream
                           ((ObjectsContext *)
                            listOfImages.
                            super__List_base<PDFImageXObject_*,_std::allocator<PDFImageXObject_*>_>.
                            _M_impl._M_node._M_size,pDVar9,false);
    pIVar10 = PDFStream::GetWriteStream(pPStack_50);
    alphaWriteStream._20_4_ = pVar6;
    if (bVar11) {
      OutputStringBufferStream::OutputStringBufferStream
                ((OutputStringBufferStream *)local_128,(MyStringBuf *)local_f0);
      while (alphaWriteStream._20_4_ != 0) {
        alphaWriteStream._20_4_ = alphaWriteStream._20_4_ + -1;
        png_read_row(png_ptr,(png_bytep)0x0,row);
        for (imageMaskContext._4_4_ = 0; imageMaskContext._4_4_ < pVar5;
            imageMaskContext._4_4_ = imageMaskContext._4_4_ + 1) {
          (*pIVar10->_vptr_IByteWriter[2])
                    (pIVar10,row + imageMaskContext._4_4_ * bVar3,(ulong)bVar1);
          OutputStringBufferStream::Write
                    ((OutputStringBufferStream *)local_128,
                     row + (ulong)bVar1 + (ulong)(imageMaskContext._4_4_ * bVar3),1);
        }
      }
      alphaWriteStream._20_4_ = alphaWriteStream._20_4_ + -1;
      OutputStringBufferStream::~OutputStringBufferStream((OutputStringBufferStream *)local_128);
    }
    else {
      while (iVar4 = alphaWriteStream._20_4_ + -1, bVar12 = alphaWriteStream._20_4_ != 0,
            alphaWriteStream._20_4_ = iVar4, bVar12) {
        png_read_row(png_ptr,row,(png_bytep)0x0);
        (*pIVar10->_vptr_IByteWriter[2])(pIVar10,row,(ulong)(pVar5 * bVar1));
      }
    }
    local_54 = ObjectsContext::EndPDFStream
                         ((ObjectsContext *)
                          listOfImages.
                          super__List_base<PDFImageXObject_*,_std::allocator<PDFImageXObject_*>_>.
                          _M_impl._M_node._M_size,pPStack_50);
    if (local_54 == eSuccess) {
      if (bVar11) {
        local_54 = ObjectsContext::StartNewIndirectObject
                             ((ObjectsContext *)
                              listOfImages.
                              super__List_base<PDFImageXObject_*,_std::allocator<PDFImageXObject_*>_>
                              ._M_impl._M_node._M_size,alphaComponentsData._96_8_);
        if (local_54 == eSuccess) {
          pDVar9 = ObjectsContext::StartDictionary
                             ((ObjectsContext *)
                              listOfImages.
                              super__List_base<PDFImageXObject_*,_std::allocator<PDFImageXObject_*>_>
                              ._M_impl._M_node._M_size);
          DictionaryContext::WriteKey(pDVar9,&scType_abi_cxx11_);
          DictionaryContext::WriteNameValue(pDVar9,&scXObject_abi_cxx11_);
          DictionaryContext::WriteKey(pDVar9,&scSubType_abi_cxx11_);
          DictionaryContext::WriteNameValue(pDVar9,&scImage_abi_cxx11_);
          DictionaryContext::WriteKey(pDVar9,&scWidth_abi_cxx11_);
          DictionaryContext::WriteIntegerValue(pDVar9,(ulong)pVar5);
          DictionaryContext::WriteKey(pDVar9,&scHeight_abi_cxx11_);
          DictionaryContext::WriteIntegerValue(pDVar9,(ulong)pVar6);
          DictionaryContext::WriteKey(pDVar9,&scBitsPerComponent_abi_cxx11_);
          DictionaryContext::WriteIntegerValue(pDVar9,(ulong)bVar2);
          DictionaryContext::WriteKey(pDVar9,&scColorSpace_abi_cxx11_);
          DictionaryContext::WriteNameValue(pDVar9,&scDeviceGray_abi_cxx11_);
          this = ObjectsContext::StartPDFStream
                           ((ObjectsContext *)
                            listOfImages.
                            super__List_base<PDFImageXObject_*,_std::allocator<PDFImageXObject_*>_>.
                            _M_impl._M_node._M_size,pDVar9,false);
          pIVar10 = PDFStream::GetWriteStream(this);
          InputStringBufferStream::InputStringBufferStream
                    ((InputStringBufferStream *)&traits,(MyStringBuf *)local_f0);
          OutputStreamTraits::OutputStreamTraits(&local_160,pIVar10);
          OutputStreamTraits::CopyToOutputStream(&local_160,(IByteReader *)&traits);
          local_54 = ObjectsContext::EndPDFStream
                               ((ObjectsContext *)
                                listOfImages.
                                super__List_base<PDFImageXObject_*,_std::allocator<PDFImageXObject_*>_>
                                ._M_impl._M_node._M_size,this);
          if (this != (PDFStream *)0x0) {
            PDFStream::~PDFStream(this);
            operator_delete(this,0xf0);
          }
          if (local_54 != eSuccess) {
            pTVar8 = Trace::DefaultTrace();
            Trace::TraceToLog(pTVar8,
                              "PNGImageHandler::CreateImageXObjectForData. Unexpected Error, could not finalize image mask stream"
                             );
          }
          OutputStreamTraits::~OutputStreamTraits(&local_160);
          InputStringBufferStream::~InputStringBufferStream((InputStringBufferStream *)&traits);
          if (local_54 == eSuccess) goto LAB_0026ab22;
        }
        else {
          pTVar8 = Trace::DefaultTrace();
          Trace::TraceToLog(pTVar8,
                            "PNGImageHandler::CreateImageXObjectForData. Unexpected Error, could not start image mask object %ld"
                            ,alphaComponentsData._96_8_);
        }
      }
      else {
LAB_0026ab22:
        imageStream = (PDFStream *)operator_new(0x20);
        if (bVar1 == 1) {
          local_248 = &KProcsetImageB_abi_cxx11_;
        }
        else {
          local_248 = &KProcsetImageC_abi_cxx11_;
        }
        PDFImageXObject::PDFImageXObject((PDFImageXObject *)imageStream,inObjectID,local_248);
      }
    }
    else {
      pTVar8 = Trace::DefaultTrace();
      Trace::TraceToLog(pTVar8,
                        "PNGImageHandler::CreateImageXObjectForData. Unexpected Error, could not finalize image stream"
                       );
    }
  }
  else {
    pTVar8 = Trace::DefaultTrace();
    Trace::TraceToLog(pTVar8,
                      "PNGImageHandler::CreateImageXObjectForData. Unexpected Error, could not start image object %ld"
                      ,inObjectID);
  }
  MyStringBuf::~MyStringBuf((MyStringBuf *)local_f0);
LAB_0026abbc:
  if (local_54 == eFailure) {
    if (imageStream != (PDFStream *)0x0) {
      PDFImageXObject::~PDFImageXObject((PDFImageXObject *)imageStream);
      operator_delete(imageStream,0x20);
    }
    imageStream = (PDFStream *)0x0;
  }
  if (pPStack_50 != (PDFStream *)0x0) {
    PDFStream::~PDFStream(pPStack_50);
    operator_delete(pPStack_50,0xf0);
  }
  std::__cxx11::list<PDFImageXObject_*,_std::allocator<PDFImageXObject_*>_>::~list
            ((list<PDFImageXObject_*,_std::allocator<PDFImageXObject_*>_> *)&imageXObject);
  return (PDFImageXObject *)imageStream;
}

Assistant:

PDFImageXObject* CreateImageXObjectForData(png_structp png_ptr, png_infop info_ptr, png_bytep row, ObjectsContext* inObjectsContext) {
	PDFImageXObjectList listOfImages;
	PDFImageXObject* imageXObject = NULL;
	PDFStream* imageStream = NULL;
	EStatusCode status = eSuccess;

	do
	{

		if (setjmp(png_jmpbuf(png_ptr)))
		{
			// reset failure pointer
			status = eFailure;
			break;
		}

		// get info
		png_uint_32 transformed_width = png_get_image_width(png_ptr, info_ptr);
		png_uint_32 transformed_height = png_get_image_height(png_ptr, info_ptr);
		png_byte transformed_color_type = png_get_color_type(png_ptr, info_ptr);
		png_byte transformed_bit_depth = png_get_bit_depth(png_ptr, info_ptr);
		png_byte channels_count = png_get_channels(png_ptr, info_ptr);
		ObjectIDType imageXObjectObjectId = inObjectsContext->GetInDirectObjectsRegistry().AllocateNewObjectID();
		// this image has only the color components, use to flag to determine what to ignore
		bool isAlpha = (transformed_color_type & PNG_COLOR_MASK_ALPHA) != 0;
		png_byte colorComponents = isAlpha ? (channels_count - 1) : channels_count;
		ObjectIDType imageMaskObjectId = isAlpha ? inObjectsContext->GetInDirectObjectsRegistry().AllocateNewObjectID():0;
		MyStringBuf alphaComponentsData;

		status = inObjectsContext->StartNewIndirectObject(imageXObjectObjectId);
		if(status != eSuccess)
		{
			TRACE_LOG1("PNGImageHandler::CreateImageXObjectForData. Unexpected Error, could not start image object %ld", imageXObjectObjectId);
			break;
		}
		DictionaryContext* imageContext = inObjectsContext->StartDictionary();

		// type
		imageContext->WriteKey(scType);
		imageContext->WriteNameValue(scXObject);

		// subtype
		imageContext->WriteKey(scSubType);
		imageContext->WriteNameValue(scImage);

		// Width
		imageContext->WriteKey(scWidth);
		imageContext->WriteIntegerValue(transformed_width);

		// Height
		imageContext->WriteKey(scHeight);
		imageContext->WriteIntegerValue(transformed_height);

		// Bits Per Component
		imageContext->WriteKey(scBitsPerComponent);
		imageContext->WriteIntegerValue(transformed_bit_depth);

		// Color Space
		imageContext->WriteKey(scColorSpace);
		imageContext->WriteNameValue(1 == colorComponents ? scDeviceGray : scDeviceRGB);

		// Mask in case of Alpha
		if (isAlpha) {
			imageContext->WriteKey(scSMask);
			imageContext->WriteNewObjectReferenceValue(imageMaskObjectId);
		}

		// now for the image
		imageStream = inObjectsContext->StartPDFStream(imageContext);
		IByteWriter* writerStream = imageStream->GetWriteStream();
		
		png_uint_32 y = transformed_height;

		if (isAlpha) {
			OutputStringBufferStream alphaWriteStream(&alphaComponentsData);

			while (y-- > 0) {
				// read (using "rectangle" method)
				png_read_row(png_ptr, NULL, row);
				// write. iterate per sample, splitting color components and alpha
				for (png_uint_32 i = 0; i < transformed_width; ++i) {
					
					// note that we're writing by color components, but multiply by channel...that's casue we're skipping alpha
					writerStream->Write((IOBasicTypes::Byte*)(row + i*channels_count), colorComponents);
					
					// write out to alpha stream as well (hummfff i don't like this...but i like less to decode the png again....
					// alpha is the last byte, so offset by color components
					alphaWriteStream.Write((IOBasicTypes::Byte*)(row + i*channels_count + colorComponents), 1);
				}
			}
		}
		else {
			while (y-- > 0) {
				// read
				png_read_row(png_ptr, row, NULL);
				// write
				writerStream->Write((IOBasicTypes::Byte*)(row), transformed_width*colorComponents);
			}
		}

		status = inObjectsContext->EndPDFStream(imageStream);
		if(status != eSuccess)
		{
			TRACE_LOG("PNGImageHandler::CreateImageXObjectForData. Unexpected Error, could not finalize image stream");
			break;
		}

		// if there's a soft mask, write it now
		if (isAlpha) {
			status = inObjectsContext->StartNewIndirectObject(imageMaskObjectId);
			if(status != eSuccess)
			{
				TRACE_LOG1("PNGImageHandler::CreateImageXObjectForData. Unexpected Error, could not start image mask object %ld", imageMaskObjectId);
				break;
			}
			DictionaryContext* imageMaskContext = inObjectsContext->StartDictionary();

			// type
			imageMaskContext->WriteKey(scType);
			imageMaskContext->WriteNameValue(scXObject);

			// subtype
			imageMaskContext->WriteKey(scSubType);
			imageMaskContext->WriteNameValue(scImage);

			// Width
			imageMaskContext->WriteKey(scWidth);
			imageMaskContext->WriteIntegerValue(transformed_width);

			// Height
			imageMaskContext->WriteKey(scHeight);
			imageMaskContext->WriteIntegerValue(transformed_height);

			// Bits Per Component
			imageMaskContext->WriteKey(scBitsPerComponent);
			imageMaskContext->WriteIntegerValue(transformed_bit_depth);

			// Color Space
			imageMaskContext->WriteKey(scColorSpace);
			imageMaskContext->WriteNameValue(scDeviceGray);

			PDFStream* imageMaskStream = inObjectsContext->StartPDFStream(imageMaskContext);
			IByteWriter* writerMaskStream = imageMaskStream->GetWriteStream();

			// write the alpha samples
			InputStringBufferStream alphaWriteStream(&alphaComponentsData);
			OutputStreamTraits traits(writerMaskStream);
			traits.CopyToOutputStream(&alphaWriteStream);

			status = inObjectsContext->EndPDFStream(imageMaskStream);
			delete imageMaskStream;
			if(status != eSuccess)
			{
				TRACE_LOG("PNGImageHandler::CreateImageXObjectForData. Unexpected Error, could not finalize image mask stream");
				break;
			}
		}

		imageXObject = new PDFImageXObject(imageXObjectObjectId, 1 == colorComponents ? KProcsetImageB : KProcsetImageC);
	} while (false);

	if (eFailure == status) {
		delete imageXObject;
		imageXObject = NULL;
	}
	delete imageStream;
	return imageXObject;
}